

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

char * __thiscall
google::protobuf::compiler::CodeGeneratorResponse::_InternalParse
          (CodeGeneratorResponse *this,char *ptr,ParseContext *ctx)

{
  uint uVar1;
  bool bVar2;
  string *s;
  uint64_t uVar3;
  CodeGeneratorResponse_File *msg;
  UnknownFieldSet *unknown;
  uint uVar4;
  char cVar5;
  ulong tag_00;
  uint32_t tag;
  char *local_48;
  uint local_3c;
  InternalMetadata *local_38;
  
  local_38 = &(this->super_Message).super_MessageLite._internal_metadata_;
  uVar4 = 0;
  local_48 = ptr;
  do {
    while( true ) {
      bVar2 = internal::ParseContext::Done(ctx,&local_48);
      if (bVar2) goto LAB_002be669;
      local_48 = internal::ReadTag(local_48,&local_3c,0);
      tag_00 = (ulong)local_3c;
      uVar1 = local_3c >> 3;
      cVar5 = (char)local_3c;
      if (uVar1 != 0xf) break;
      if (cVar5 == 'z') {
        local_48 = local_48 + -1;
        do {
          local_48 = local_48 + 1;
          msg = RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::Add
                          (&this->file_);
          local_48 = internal::ParseContext::ParseMessage(ctx,(MessageLite *)msg,local_48);
          if (local_48 == (char *)0x0) goto LAB_002be661;
        } while ((local_48 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_48 == 'z'));
      }
      else {
LAB_002be628:
        if ((tag_00 == 0) || ((local_3c & 7) == 4)) {
          if (local_48 != (char *)0x0) {
            (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = local_3c - 1;
            goto LAB_002be669;
          }
          goto LAB_002be661;
        }
        unknown = internal::InternalMetadata::
                  mutable_unknown_fields<google::protobuf::UnknownFieldSet>(local_38);
        local_48 = internal::UnknownFieldParse(tag_00,unknown,local_48,ctx);
        if (local_48 == (char *)0x0) goto LAB_002be661;
      }
    }
    if (uVar1 == 2) {
      if (cVar5 == '\x10') {
        uVar4 = 2;
        uVar3 = internal::ReadVarint64(&local_48);
        this->supported_features_ = uVar3;
        goto LAB_002be5d8;
      }
      goto LAB_002be628;
    }
    if ((uVar1 != 1) || (cVar5 != '\n')) goto LAB_002be628;
    s = _internal_mutable_error_abi_cxx11_(this);
    local_48 = internal::InlineGreedyStringParser(s,local_48,ctx);
    internal::VerifyUTF8(s,"google.protobuf.compiler.CodeGeneratorResponse.error");
LAB_002be5d8:
  } while (local_48 != (char *)0x0);
LAB_002be661:
  local_48 = (char *)0x0;
LAB_002be669:
  (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar4;
  return local_48;
}

Assistant:

const char* CodeGeneratorResponse::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // optional string error = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          auto str = _internal_mutable_error();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          #ifndef NDEBUG
          ::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.compiler.CodeGeneratorResponse.error");
          #endif  // !NDEBUG
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // optional uint64 supported_features = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 16)) {
          _Internal::set_has_supported_features(&has_bits);
          supported_features_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // repeated .google.protobuf.compiler.CodeGeneratorResponse.File file = 15;
      case 15:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 122)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_file(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<122>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}